

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::DitheringCase::drawAndCheckGradient
          (DitheringCase *this,bool isVerticallyIncreasing,Vec4 *highColor)

{
  TextureFormat TVar1;
  RenderContext *context;
  int iVar2;
  byte bVar3;
  char *pcVar4;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  GLenum GVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Vec4 *pVVar10;
  ostream *poVar11;
  Surface *pSVar12;
  long lVar13;
  void *__buf;
  void *__buf_00;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  Surface renderedImg;
  Vec4 inputClr;
  Surface errorMask;
  Random rnd;
  Surface local_310;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string local_2d0;
  ulong local_2b0;
  Vec4 *local_2a8;
  Surface local_2a0;
  Vec4 local_288;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  undefined1 local_260 [24];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [4];
  ios_base local_1f0 [264];
  deRandom local_e8;
  Quad local_d8;
  
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2a8 = highColor;
  dVar6 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_e8,dVar6);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)CONCAT44(extraout_var,iVar7);
  if (0xff < iVar7) {
    iVar7 = 0x100;
  }
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = *(int *)(CONCAT44(extraout_var_00,iVar8) + 4);
  iVar18 = 0x100;
  if (iVar8 < 0x100) {
    iVar18 = iVar8;
  }
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = *(int *)CONCAT44(extraout_var_01,iVar8);
  dVar6 = deRandom_getUint32(&local_e8);
  uVar16 = dVar6 % ((iVar8 - iVar7) + 1U);
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = *(int *)(CONCAT44(extraout_var_02,iVar8) + 4);
  dVar6 = deRandom_getUint32(&local_e8);
  uVar14 = dVar6 % ((iVar8 - iVar18) + 1U);
  local_288.m_data[0] = 0.0;
  local_288.m_data[1] = 0.0;
  local_288.m_data[2] = 0.0;
  local_288.m_data[3] = 0.0;
  local_d8.posA.m_data[0] = -1.0;
  local_d8.posA.m_data[1] = -1.0;
  local_d8.posB.m_data[0] = 1.0;
  local_d8.posB.m_data[1] = 1.0;
  memset(local_d8.color,0,0x90);
  tcu::Surface::Surface(&local_310,iVar7,iVar18);
  glwViewport(uVar16,uVar14,iVar7,iVar18);
  GVar9 = glwGetError();
  glu::checkError(GVar9,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0xfe);
  local_268 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,"Dithering is ",0xd);
  pcVar15 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((ulong)this->m_ditheringEnabled != 0) {
    pcVar15 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_260,pcVar15 + 0x27,8 - (ulong)this->m_ditheringEnabled);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  std::ios_base::~ios_base(local_1f0);
  if (this->m_ditheringEnabled == true) {
    glwEnable(0xbd0);
    dVar6 = glwGetError();
    iVar8 = 0x103;
    pcVar15 = "glEnable(GL_DITHER)";
  }
  else {
    glwDisable(0xbd0);
    dVar6 = glwGetError();
    iVar8 = 0x105;
    pcVar15 = "glDisable(GL_DITHER)";
  }
  glu::checkError(dVar6,pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,iVar8);
  local_268 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,"Drawing a ",10);
  pcVar15 = "horizontally";
  if (isVerticallyIncreasing) {
    pcVar15 = "vertically";
  }
  local_2b0 = (ulong)!isVerticallyIncreasing;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_260,pcVar15,local_2b0 * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_260," increasing gradient",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  std::ios_base::~ios_base(local_1f0);
  local_d8.color[0].m_data[0] = 0.0;
  local_d8.color[0].m_data[1] = 0.0;
  local_d8.color[0].m_data[2] = 0.0;
  local_d8.color[0].m_data[3] = 0.0;
  pVVar10 = &local_288;
  if (isVerticallyIncreasing) {
    pVVar10 = local_2a8;
  }
  local_d8.color[1].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
  local_d8.color[1].m_data._8_8_ = *(undefined8 *)(pVVar10->m_data + 2);
  pVVar10 = &local_288;
  if (!isVerticallyIncreasing) {
    pVVar10 = local_2a8;
  }
  local_d8.color[2].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
  local_d8.color[2].m_data._8_8_ = *(undefined8 *)(pVVar10->m_data + 2);
  local_d8.color[3].m_data._0_8_ = *(undefined8 *)local_2a8->m_data;
  local_d8.color[3].m_data._8_8_ = *(undefined8 *)(local_2a8->m_data + 2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&local_d8);
  context = this->m_renderCtx;
  local_2f8._0_4_ = RGBA;
  local_2f8._4_4_ = UNORM_INT8;
  if ((void *)local_310.m_pixels.m_cap != (void *)0x0) {
    local_310.m_pixels.m_cap = (size_t)local_310.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_268,(TextureFormat *)local_2f8,local_310.m_width,
             local_310.m_height,1,(void *)local_310.m_pixels.m_cap);
  glu::readPixels(context,uVar16,uVar14,(PixelBufferAccess *)local_268);
  GVar9 = glwGetError();
  glu::checkError(GVar9,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0x111);
  pcVar15 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar15 = "VerGradient";
  }
  pcVar4 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar4 = "VerGradient";
  }
  local_2f8 = (undefined1  [8])&local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,pcVar15,pcVar4 + 0xb);
  pcVar15 = "Horizontal gradient";
  if (isVerticallyIncreasing) {
    pcVar15 = "Vertical gradient";
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,pcVar15,pcVar15 + local_2b0 * 2 + 0x11);
  pSVar12 = &local_310;
  tcu::LogImage::LogImage
            ((LogImage *)local_268,(string *)local_2f8,&local_2d0,pSVar12,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_268,TVar1.order,__buf,(size_t)pSVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != local_238) {
    operator_delete(local_248._M_p,local_238[0]._M_allocated_capacity + 1);
  }
  if (local_268 != (undefined1  [8])((long)local_260 + 8)) {
    operator_delete((void *)local_268,local_260._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8 != (undefined1  [8])&local_2e8) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  tcu::Surface::Surface(&local_2a0,iVar7,iVar18);
  if (0 < local_310.m_height) {
    iVar18 = 0;
    bVar20 = true;
    local_278 = local_288.m_data[0];
    fStack_274 = local_288.m_data[1];
    fStack_270 = local_288.m_data[2];
    fStack_26c = local_288.m_data[3];
    iVar7 = local_310.m_width;
    iVar8 = local_310.m_height;
    do {
      if (0 < iVar7) {
        iVar17 = 0;
        do {
          iVar8 = iVar17;
          if (isVerticallyIncreasing) {
            iVar8 = iVar18;
          }
          iVar2 = local_310.m_height;
          if (!isVerticallyIncreasing) {
            iVar2 = iVar7;
          }
          fVar21 = ((float)iVar8 + 0.5) / (float)iVar2;
          fVar22 = 1.0 - fVar21;
          fStack_2f0 = local_2a8->m_data[2] * fVar21 + fVar22 * fStack_270;
          fStack_2ec = local_2a8->m_data[3] * fVar21 + fVar22 * fStack_26c;
          local_2f8._4_4_ = local_2a8->m_data[1] * fVar21 + fVar22 * fStack_274;
          local_2f8._0_4_ = local_2a8->m_data[0] * fVar21 + fVar22 * local_278;
          local_268._0_4_ =
               *(ChannelOrder *)
                ((long)local_310.m_pixels.m_ptr + (long)(iVar7 * iVar18 + iVar17) * 4);
          bVar5 = checkColor(this,(Vec4 *)local_2f8,(RGBA *)local_268,bVar20);
          lVar13 = (long)(local_2a0.m_width * iVar18 + iVar17);
          if (bVar5) {
            *(undefined4 *)((long)local_2a0.m_pixels.m_ptr + lVar13 * 4) = 0xff00ff00;
          }
          else {
            *(undefined4 *)((long)local_2a0.m_pixels.m_ptr + lVar13 * 4) = 0xff0000ff;
            if (bVar20 != false) {
              local_268 = (undefined1  [8])TVar1;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_260,"First failure at pixel (",0x18);
              std::ostream::operator<<((ostringstream *)local_260,iVar17);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,", ",2);
              std::ostream::operator<<((ostringstream *)local_260,iVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_260,") (not printing further errors)",0x1f);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
              std::ios_base::~ios_base(local_1f0);
              bVar20 = false;
            }
          }
          iVar17 = iVar17 + 1;
          iVar7 = local_310.m_width;
          iVar8 = local_310.m_height;
        } while (iVar17 < local_310.m_width);
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < iVar8);
    if (bVar20 == false) {
      local_2f8 = (undefined1  [8])&local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"ColorChoiceErrorMask","")
      ;
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2d0,"Error mask for color choices","");
      pSVar12 = &local_2a0;
      tcu::LogImage::LogImage
                ((LogImage *)local_268,(string *)local_2f8,&local_2d0,pSVar12,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_268,TVar1.order,__buf_00,(size_t)pSVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != local_238) {
        operator_delete(local_248._M_p,local_238[0]._M_allocated_capacity + 1);
      }
      if (local_268 != (undefined1  [8])((long)local_260 + 8)) {
        operator_delete((void *)local_268,local_260._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != (undefined1  [8])&local_2e8) {
        operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      tcu::Surface::~Surface(&local_2a0);
LAB_0120cdb8:
      bVar20 = false;
      goto LAB_0120cdba;
    }
  }
  tcu::Surface::~Surface(&local_2a0);
  bVar20 = true;
  if (this->m_ditheringEnabled == false) {
    iVar7 = local_310.m_height;
    iVar8 = local_310.m_width;
    if (isVerticallyIncreasing) {
      iVar7 = local_310.m_width;
      iVar8 = local_310.m_height;
    }
    if (0 < iVar8) {
      iVar18 = 0;
      bVar3 = 0;
      do {
        if (0 < iVar7) {
          iVar17 = 0;
          uVar14 = 0;
          do {
            iVar19 = iVar17;
            iVar2 = iVar18;
            if (isVerticallyIncreasing) {
              iVar19 = iVar18;
              iVar2 = iVar17;
            }
            uVar16 = *(uint *)((long)local_310.m_pixels.m_ptr +
                              (long)(local_310.m_width * iVar19 + iVar2) * 4);
            bVar20 = uVar16 != uVar14 && iVar17 != 0;
            if ((bool)(bVar20 & bVar3)) {
              local_268 = (undefined1  [8])TVar1;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_260,"Failure: colors should be constant per ",0x27);
              pcVar15 = "column";
              if (isVerticallyIncreasing) {
                pcVar15 = "row";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_260,pcVar15,local_2b0 * 3 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_260,
                         " (since dithering is disabled), but the color at position (",0x3b);
              std::ostream::operator<<(local_260,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,", ",2);
              std::ostream::operator<<(local_260,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,") is ",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,"RGBA(",5);
              poVar11 = (ostream *)std::ostream::operator<<(local_260,uVar16 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar16 >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar16 >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar16 >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_260," and does not equal the color at (",0x22);
              iVar7 = iVar18;
              if (isVerticallyIncreasing) {
                iVar7 = iVar17 + -1;
              }
              std::ostream::operator<<((ostringstream *)local_260,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,", ",2);
              iVar7 = iVar17 + -1;
              if (isVerticallyIncreasing) {
                iVar7 = iVar18;
              }
              std::ostream::operator<<((ostringstream *)local_260,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_260,"), which is ",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,"RGBA(",5);
              poVar11 = (ostream *)
                        std::ostream::operator<<((ostringstream *)local_260,uVar14 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar14 >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar14 >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar14 >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
              std::ios_base::~ios_base(local_1f0);
              goto LAB_0120cdb8;
            }
            bVar3 = bVar3 | bVar20;
            iVar17 = iVar17 + 1;
            uVar14 = uVar16;
          } while (iVar7 != iVar17);
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 != iVar8);
      bVar20 = true;
    }
  }
LAB_0120cdba:
  tcu::Surface::~Surface(&local_310);
  return bVar20;
}

Assistant:

bool DitheringCase::drawAndCheckGradient (const bool isVerticallyIncreasing, const Vec4& highColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 256;
	const int					maxViewportHei		= 256;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	const Vec4					quadClr0			(0.0f, 0.0f, 0.0f, 0.0f);
	const Vec4&					quadClr1			= highColor;
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing a " << (isVerticallyIncreasing ? "vertically" : "horizontally") << " increasing gradient" << TestLog::EndMessage;

	quad.color[0] = quadClr0;
	quad.color[1] = isVerticallyIncreasing ? quadClr1 : quadClr0;
	quad.color[2] = isVerticallyIncreasing ? quadClr0 : quadClr1;
	quad.color[3] = quadClr1;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(isVerticallyIncreasing ? "VerGradient"		: "HorGradient",
						  isVerticallyIncreasing ? "Vertical gradient"	: "Horizontal gradient",
						  renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const float		inputF		= ((float)(isVerticallyIncreasing ? y : x) + 0.5f) / (float)(isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth());
				const Vec4		inputClr	= (1.0f-inputF)*quadClr0 + inputF*quadClr1;

				if (!checkColor(inputClr, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the colors must be constant in the gradient's constant direction.

	if (!m_ditheringEnabled)
	{
		const int	increasingDirectionSize	= isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth();
		const int	constantDirectionSize	= isVerticallyIncreasing ? renderedImg.getWidth() : renderedImg.getHeight();
		bool		colorHasChanged			= false;

		for (int incrPos = 0; incrPos < increasingDirectionSize; incrPos++)
		{
			tcu::RGBA prevConstantDirectionPix;
			for (int constPos = 0; constPos < constantDirectionSize; constPos++)
			{
				const int			x		= isVerticallyIncreasing ? constPos : incrPos;
				const int			y		= isVerticallyIncreasing ? incrPos : constPos;
				const tcu::RGBA		clr		= renderedImg.getPixel(x, y);

				if (constPos > 0 && clr != prevConstantDirectionPix)
				{
					if (colorHasChanged)
					{
						log << TestLog::Message
							<< "Failure: colors should be constant per " << (isVerticallyIncreasing ? "row" : "column")
							<< " (since dithering is disabled), but the color at position (" << x << ", " << y << ") is " << clr
							<< " and does not equal the color at (" << (isVerticallyIncreasing ? x-1 : x) << ", " << (isVerticallyIncreasing ? y : y-1) << "), which is " << prevConstantDirectionPix
							<< TestLog::EndMessage;

						return false;
					}
					else
						colorHasChanged = true;
				}

				prevConstantDirectionPix = clr;
			}
		}
	}

	return true;
}